

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_feature(lyout *out,lys_feature *feat,int *first)

{
  char *pcVar1;
  bool bVar2;
  uint local_28;
  int local_24;
  uint j;
  int f;
  int *first_local;
  lys_feature *feat_local;
  lyout *out_local;
  
  local_24 = 1;
  bVar2 = false;
  if (first != (int *)0x0) {
    bVar2 = *first != 0;
  }
  pcVar1 = ",";
  if (bVar2) {
    pcVar1 = "";
  }
  _j = first;
  first_local = (int *)feat;
  feat_local = (lys_feature *)out;
  ly_print(out,"%s\"%s\":{",pcVar1,feat->name);
  jsons_print_text((lyout *)feat_local,"description","text",*(char **)(first_local + 2),1,&local_24)
  ;
  jsons_print_text((lyout *)feat_local,"reference","text",*(char **)(first_local + 4),1,&local_24);
  jsons_print_status((lyout *)feat_local,*(uint16_t *)(first_local + 6),&local_24);
  jsons_print_iffeatures
            ((lyout *)feat_local,*(lys_module **)(first_local + 0xc),
             *(lys_iffeature **)(first_local + 10),*(uint8_t *)((long)first_local + 0x1b),&local_24)
  ;
  if ((*(long *)(first_local + 0xe) != 0) && (*(int *)(*(long *)(first_local + 0xe) + 4) != 0)) {
    pcVar1 = ",";
    if (local_24 != 0) {
      pcVar1 = "";
    }
    ly_print((lyout *)feat_local,"%s\"depending-features\":[",pcVar1);
    for (local_28 = 0; local_28 < *(uint *)(*(long *)(first_local + 0xe) + 4);
        local_28 = local_28 + 1) {
      pcVar1 = "";
      if (local_28 != 0) {
        pcVar1 = ",";
      }
      ly_print((lyout *)feat_local,"%s\"%s\"",pcVar1,
               **(undefined8 **)(*(long *)(*(long *)(first_local + 0xe) + 8) + (ulong)local_28 * 8))
      ;
    }
    ly_print((lyout *)feat_local,"]");
  }
  ly_print((lyout *)feat_local,"}");
  if (_j != (int *)0x0) {
    *_j = 0;
  }
  return;
}

Assistant:

static void
jsons_print_feature(struct lyout *out, const struct lys_feature *feat, int *first)
{
    int f = 1;
    unsigned int j;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", feat->name);
    jsons_print_text(out, "description", "text", feat->dsc, 1, &f);
    jsons_print_text(out, "reference", "text", feat->ref, 1, &f);
    jsons_print_status(out, feat->flags, &f);
    jsons_print_iffeatures(out, feat->module, feat->iffeature, feat->iffeature_size, &f);
    if (feat->depfeatures && feat->depfeatures->number) {
        ly_print(out, "%s\"depending-features\":[", f ? "" : ",");
        for (j = 0; j < feat->depfeatures->number; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", ((struct lys_feature*)(feat->depfeatures->set.g[j]))->name);
        }
        ly_print(out, "]");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}